

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

bool __thiscall sjtu::trainType::getrecord(trainType *this,recordType *record,bool flag)

{
  pointer pcVar1;
  timeType *other;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  undefined7 in_register_00000011;
  long lVar7;
  long lVar8;
  int unaff_R14D;
  timeType local_a8;
  timeType *local_98;
  undefined4 local_90;
  undefined4 local_8c;
  timeType *local_88;
  recordType *local_80;
  string *local_78;
  timeType local_70;
  timeType *local_60;
  string *local_58;
  string local_50;
  
  local_90 = (undefined4)CONCAT71(in_register_00000011,flag);
  if (this->is_released == true) {
    local_a8.month = this->saleDate[0].month;
    local_a8.day = this->saleDate[0].day;
    local_a8.hour = (this->startTime).hour;
    local_a8.minute = (this->startTime).minute;
    if (this->stationNum < 1) {
      bVar3 = false;
      bVar6 = 0;
    }
    else {
      local_88 = this->saleDate;
      local_78 = record->station + 1;
      local_58 = record->station;
      local_98 = record->time;
      local_60 = this->saleDate + 1;
      lVar8 = 0;
      lVar7 = 0;
      bVar3 = false;
      local_80 = record;
      do {
        if (lVar8 != 0) {
          timeType::operator+(&local_70,&local_a8.month);
          local_a8.month = local_70.month;
          local_a8.day = local_70.day;
          local_a8.hour = local_70.hour;
          local_a8.minute = local_70.minute;
        }
        if (bVar3) {
          iVar4 = *(int *)((long)this->stations[0].seatNum + (long)unaff_R14D * 4 + lVar8);
          if (record->seat < iVar4) {
            iVar4 = record->seat;
          }
          record->seat = iVar4;
          record->price = record->price + *(int *)((long)&this->stations[0].price + lVar8);
          record->duration =
               record->duration + *(int *)((long)&this->stations[0].travelTime + lVar8);
          iVar4 = std::__cxx11::string::compare((char *)local_78);
          if (iVar4 == 0) {
            record->time[1].month = local_a8.month;
            record->time[1].day = local_a8.day;
            record->time[1].hour = local_a8.hour;
            record->time[1].minute = local_a8.minute;
            bVar6 = 1;
            goto LAB_0010e6ba;
          }
          record->duration =
               record->duration + *(int *)((long)&this->stations[0].stopoverTime + lVar8);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)local_78);
          if (iVar4 == 0) break;
        }
        if (lVar8 != 0) {
          timeType::operator+(&local_70,&local_a8.month);
          local_a8.month = local_70.month;
          local_a8.day = local_70.day;
          local_a8.hour = local_70.hour;
          local_a8.minute = local_70.minute;
        }
        iVar4 = std::__cxx11::string::compare((char *)local_58);
        other = local_98;
        if (iVar4 == 0) {
          record->price = 0;
          record->seat = 100000;
          record->duration = 0;
          if ((char)local_90 == '\0') {
            local_a8.month = local_98->month;
            local_a8.day = local_98->day;
          }
          else {
            bVar2 = timeType::operator<(&local_a8,local_98);
            if (bVar2) {
              local_a8.month = other->month;
              local_a8.day = other->day;
            }
            bVar2 = timeType::operator<(&local_a8,other);
            if (bVar2) {
              local_8c = 0x5a0;
              timeType::operator+(&local_70,&local_a8.month);
              local_a8.month = local_70.month;
              local_a8.day = local_70.day;
              local_a8.hour = local_70.hour;
              local_a8.minute = local_70.minute;
            }
          }
          iVar4 = timeType::dateminus(&local_a8,local_88);
          pcVar1 = local_80->station[0]._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + local_80->station[0]._M_string_length);
          iVar5 = get_Delta_date(this,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          record = local_80;
          unaff_R14D = iVar5 + iVar4;
          if ((unaff_R14D < 0) ||
             (iVar4 = timeType::dateminus(local_60,local_88), iVar4 < unaff_R14D)) break;
          local_98->month = local_a8.month;
          local_98->day = local_a8.day;
          local_98->hour = local_a8.hour;
          local_98->minute = local_a8.minute;
          bVar3 = true;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x1a8;
      } while (lVar7 < this->stationNum);
      bVar6 = 0;
    }
LAB_0010e6ba:
    bVar3 = (bool)(bVar3 & bVar6);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool getrecord(recordType *record , bool flag = false)
		{
			if (!is_released) return false;
			timeType actual_time(startTime);
			actual_time.month = saleDate[0].month , actual_time.day = saleDate[0].day;
			bool found = false , end_flag = false;
			for (int i = 0 , day_id;i < stationNum;++ i)
			{
				if (i) actual_time = actual_time + stations[i].travelTime;
				if (found)
				{
					record -> seat = record -> seat < stations[i].seatNum[day_id] ? record -> seat : stations[i].seatNum[day_id];
					record -> price += stations[i].price , record -> duration += stations[i].travelTime;
					if (stations[i].stationName == record -> station[1])
					{
						record -> time[1] = actual_time , end_flag = true;
						break;
					}
					record -> duration += stations[i].stopoverTime;
				}
				else if (stations[i].stationName == record -> station[1]) break;
				if (i) actual_time = actual_time + stations[i].stopoverTime;
				if (stations[i].stationName == record -> station[0])
				{
					record -> price = 0 , record -> duration = 0 , record -> seat = 100000;
					if (!flag || actual_time < record -> time[0]) actual_time.month = record -> time[0].month , actual_time.day = record -> time[0].day;
					if (flag && actual_time < record -> time[0]) actual_time = actual_time + 24 * 60;
					day_id = timeType::dateminus(actual_time , saleDate[0]) + get_Delta_date(record -> station[0]);
					if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) break;
					record -> time[0] = actual_time;
					found = true;
				}
			}
			if (!found || !end_flag) return false;
			return true;
		}